

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SCASerialization.h
# Opt level: O2

void __thiscall
Js::SerializationCloner<Js::StreamWriter>::WriteObjectProperties<Js::ObjectPropertyEnumerator>
          (SerializationCloner<Js::StreamWriter> *this,ObjectPropertyEnumerator *enumerator)

{
  bool bVar1;
  charcount_t len;
  undefined8 in_RAX;
  char16 *str;
  Engine *this_00;
  undefined8 uStack_28;
  
  uStack_28 = in_RAX;
  while( true ) {
    bVar1 = ObjectPropertyEnumerator::MoveNext(enumerator);
    if (!bVar1) break;
    str = ObjectPropertyEnumerator::GetNameString(enumerator);
    len = ObjectPropertyEnumerator::GetNameLength(enumerator);
    Write(this,str,len);
    this_00 = ClonerBase<void_*,_unsigned_int,_Js::TypeId,_Js::SerializationCloner<Js::StreamWriter>_>
              ::GetEngine(&this->
                           super_ClonerBase<void_*,_unsigned_int,_Js::TypeId,_Js::SerializationCloner<Js::StreamWriter>_>
                         );
    SCAEngine<void_*,_unsigned_int,_Js::SerializationCloner<Js::StreamWriter>_>::Clone
              (this_00,enumerator->m_value);
  }
  uStack_28 = CONCAT44(0xffffffff,(undefined4)uStack_28);
  StreamWriter::Write<unsigned_int>(this->m_writer,(uint *)((long)&uStack_28 + 4));
  return;
}

Assistant:

void WriteObjectProperties(Enumerator* enumerator)
        {
            while (enumerator->MoveNext())
            {
                // Write property name
                Write(enumerator->GetNameString(), enumerator->GetNameLength());

                // Write property value
                this->GetEngine()->Clone(enumerator->GetValue());
            }

            // Write property terminator
            m_writer->Write(static_cast<uint32>(SCA_PROPERTY_TERMINATOR));
        }